

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O3

void __thiscall
duckdb::Binder::ExtractUnpivotColumnName
          (Binder *this,ParsedExpression *expr,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *result)

{
  ExpressionType EVar1;
  ColumnRefExpression *this_00;
  string *__x;
  BinderException *this_01;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  EVar1 = (expr->super_BaseExpression).type;
  if (EVar1 == COLUMN_REF) {
    this_00 = BaseExpression::Cast<duckdb::ColumnRefExpression>(&expr->super_BaseExpression);
    __x = ColumnRefExpression::GetColumnName_abi_cxx11_(this_00);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)result,__x);
    return;
  }
  if (EVar1 != SUBQUERY) {
    local_28 = ::std::
               _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/tableref/bind_pivot.cpp:561:12)>
               ::_M_invoke;
    local_30 = ::std::
               _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/tableref/bind_pivot.cpp:561:12)>
               ::_M_manager;
    local_40._M_unused._M_object = this;
    local_40._8_8_ = result;
    ParsedExpressionIterator::EnumerateChildren
              (expr,(function<void_(duckdb::ParsedExpression_&)> *)&local_40);
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,3);
    }
    return;
  }
  this_01 = (BinderException *)__cxa_allocate_exception(0x10);
  local_40._M_unused._M_object = &local_30;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"UNPIVOT list cannot contain subqueries","");
  BinderException::BinderException<>(this_01,expr,(string *)&local_40);
  __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Binder::ExtractUnpivotColumnName(ParsedExpression &expr, vector<string> &result) {
	if (expr.GetExpressionType() == ExpressionType::COLUMN_REF) {
		auto &colref = expr.Cast<ColumnRefExpression>();
		result.push_back(colref.GetColumnName());
		return;
	}
	if (expr.GetExpressionType() == ExpressionType::SUBQUERY) {
		throw BinderException(expr, "UNPIVOT list cannot contain subqueries");
	}
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](ParsedExpression &child) { ExtractUnpivotColumnName(child, result); });
}